

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::PoissonRegressionLoss::forward_impl
          (PoissonRegressionLoss *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  float __x;
  uint uVar1;
  const_reference ppTVar2;
  long in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  long in_RDI;
  float fVar3;
  __type_conflict1 _Var4;
  float x;
  __type_conflict1 z;
  uint y;
  
  uVar1 = **(uint **)(in_RDI + 0x58);
  _Var4 = std::lgamma<unsigned_int>(0);
  ppTVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (in_RSI,0);
  __x = *(*ppTVar2)->v;
  fVar3 = expf(__x);
  **(float **)(in_RDX + 0x28) = (float)(((double)fVar3 + _Var4) - (double)((float)uVar1 * __x));
  return;
}

Assistant:

void PoissonRegressionLoss::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("PoissonRegressionLoss not yet implemented for CUDA");
#else
  const auto y = *pty;
  const auto z = lgamma(y + 1);
  const auto x = xs[0]->v[0];
  fx.v[0] = expf(x) + z - y * x;
#endif
}